

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::Option::set_abi_cxx11_
          (string *__return_storage_ptr__,Option *this,optional<bool> *target,string_view name,
          string_view value)

{
  _Optional_payload_base<bool> _Var1;
  optional<bool> *target_local;
  Option *this_local;
  string_view name_local;
  string *error;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  _Var1 = (_Optional_payload_base<bool>)parseBool(name,value,__return_storage_ptr__);
  (target->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
       _Var1;
  return __return_storage_ptr__;
}

Assistant:

std::string CommandLine::Option::set(std::optional<bool>& target, string_view name,
                                     string_view value) {
    std::string error;
    target = parseBool(name, value, error);
    return error;
}